

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidEdgeTopology(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  ON_BrepEdge *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  ON_BrepEdge *pOVar5;
  ON_BrepVertex *pOVar6;
  int *piVar7;
  ON_BrepTrim *pOVar8;
  bool bVar9;
  int iVar10;
  ON_Curve *pOVar11;
  ON_Curve *pOVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  uint uVar19;
  long lVar20;
  double dVar21;
  ON_Interval proxy_sub_dom;
  ON_Interval edge_dom;
  ON_Interval c3_dom;
  double local_78;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  uVar16 = (ulong)(uint)edge_index;
  if ((edge_index < 0) ||
     ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count <=
      edge_index)) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    uVar19 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
    pcVar18 = "brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n";
LAB_0040cb63:
    ON_TextLog::Print(text_log,pcVar18,uVar16,(ulong)uVar19);
    return false;
  }
  pOVar5 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
  this_00 = pOVar5 + uVar16;
  if (pOVar5[uVar16].m_edge_index == edge_index) {
    if (this_00->m_brep == this) {
      iVar10 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                 _vptr_ON_Object[6])(this_00,text_log);
      if ((char)iVar10 != '\0') {
        uVar19 = this_00->m_c3i;
        lVar20 = (long)(int)uVar19;
        if ((-1 < lVar20) && ((int)uVar19 < (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count))
        {
          if ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar20] == (ON_Curve *)0x0) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",
                              uVar16,(ulong)uVar19,(ulong)uVar19);
            return false;
          }
          pOVar11 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
          if (pOVar11 == (ON_Curve *)0x0) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar18 = "brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n";
            goto LAB_0040cb63;
          }
          pOVar11 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar20];
          pOVar12 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
          if (pOVar11 != pOVar12) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
            ON_TextLog::PushIndent(text_log);
            pcVar18 = "m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n";
            local_78 = (double)uVar16;
LAB_0040cc55:
            ON_TextLog::Print(text_log,pcVar18,local_78,(ulong)uVar19,(ulong)uVar19,uVar16);
            goto LAB_0040cc96;
          }
          local_60 = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
          dVar21 = local_60.m_t[1];
          bVar9 = ON_Interval::IsIncreasing(&local_60);
          if (bVar9) {
            (*((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar20]->super_ON_Geometry).
              super_ON_Object._vptr_ON_Object[0x25])();
            local_40.m_t[1] = dVar21;
            bVar9 = ON_Interval::Includes(&local_40,&local_60,false);
            if (!bVar9) {
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
              ON_TextLog::PushIndent(text_log);
              pdVar15 = ON_Interval::operator[](&local_40,0);
              dVar21 = *pdVar15;
              pdVar15 = ON_Interval::operator[](&local_40,1);
              dVar1 = *pdVar15;
              pdVar15 = ON_Interval::operator[](&local_60,0);
              dVar2 = *pdVar15;
              pdVar15 = ON_Interval::operator[](&local_60,1);
              ON_TextLog::Print(text_log,
                                "m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n"
                                ,dVar21,dVar1,dVar2,*pdVar15,(ulong)uVar19,uVar16);
              goto LAB_0040cc96;
            }
            (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x25])(this_00);
            local_50.m_t[1] = dVar21;
            bVar9 = ON_Interval::IsIncreasing(&local_50);
            if (bVar9) {
              uVar19 = this_00->m_vi[0];
              if (((int)uVar19 < 0) ||
                 (iVar10 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                           super_ON_ClassArray<ON_BrepVertex>.m_count, iVar10 <= (int)uVar19)) {
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                ON_TextLog::PushIndent(text_log);
                uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                        super_ON_ClassArray<ON_BrepVertex>.m_count;
                pcVar18 = "edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n";
              }
              else {
                uVar19 = this_00->m_vi[1];
                if ((int)uVar19 < iVar10 && -1 < (int)uVar19) {
                  uVar14 = 0;
                  do {
                    iVar10 = this_00->m_vi[uVar14];
                    pOVar6 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                             super_ON_ClassArray<ON_BrepVertex>.m_a;
                    if (iVar10 != pOVar6[iVar10].m_vertex_index) {
                      if (text_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                      ON_TextLog::PushIndent(text_log);
                      uVar16 = (ulong)(uint)this_00->m_vi[uVar14];
                      pcVar18 = "edge.m_vi[%d]=%d is a deleted vertex\n";
                      local_78 = (double)(uVar14 & 0xffffffff);
                      goto LAB_0040cba7;
                    }
                    uVar13 = (ulong)pOVar6[iVar10].m_ei.m_count;
                    if ((long)uVar13 < 1) {
                      bVar9 = false;
                    }
                    else {
                      uVar17 = 1;
                      do {
                        iVar3 = pOVar6[iVar10].m_ei.m_a[uVar17 - 1];
                        bVar9 = iVar3 == edge_index;
                        if (uVar13 <= uVar17) break;
                        uVar17 = uVar17 + 1;
                      } while (iVar3 != edge_index);
                    }
                    if (!bVar9) {
                      if (text_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                      ON_TextLog::PushIndent(text_log);
                      ON_TextLog::Print(text_log,
                                        "edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n"
                                        ,uVar14 & 0xffffffff,(ulong)(uint)this_00->m_vi[uVar14],
                                        (ulong)(uint)this_00->m_vi[uVar14]);
                      ON_TextLog::PopIndent(text_log);
                      return false;
                    }
                    bVar9 = uVar14 == 0;
                    uVar14 = uVar14 + 1;
                  } while (bVar9);
                  iVar10 = (this_00->m_ti).m_count;
                  uVar14 = (ulong)iVar10;
                  if ((long)uVar14 < 0) {
                    if (text_log == (ON_TextLog *)0x0) {
                      return false;
                    }
                    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                    ON_TextLog::PushIndent(text_log);
                    pcVar18 = "edge.m_ti.Count() < 0\n";
                    goto LAB_0040cc8c;
                  }
                  if (iVar10 == 0) {
                    return iVar10 == 0;
                  }
                  piVar7 = (this_00->m_ti).m_a;
                  pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_a;
                  local_78 = 0.0;
                  while( true ) {
                    uVar19 = piVar7[(long)local_78];
                    lVar20 = (long)(int)uVar19;
                    if ((lVar20 < 0) ||
                       ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_count <= (int)uVar19)) break;
                    if (pOVar8[lVar20].m_trim_index != uVar19) {
                      if (text_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                      ON_TextLog::PushIndent(text_log);
                      pcVar18 = "edge.m_ti[%d]=%d is a deleted trim\n";
                      goto LAB_0040d227;
                    }
                    if (local_78 != 0.0) {
                      uVar13 = 0;
                      do {
                        if (piVar7[uVar13] == uVar19) {
                          if (text_log == (ON_TextLog *)0x0) {
                            return false;
                          }
                          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                          ON_TextLog::PushIndent(text_log);
                          ON_TextLog::Print(text_log,
                                            "edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n"
                                            ,uVar13 & 0xffffffff,local_78,(ulong)uVar19);
                          goto LAB_0040cc96;
                        }
                        uVar13 = uVar13 + 1;
                      } while (local_78 != (double)uVar13);
                    }
                    if (pOVar8[lVar20].m_ei != edge_index) {
                      if (text_log == (ON_TextLog *)0x0) {
                        return false;
                      }
                      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                      ON_TextLog::PushIndent(text_log);
                      uVar16 = (ulong)(uint)pOVar8[lVar20].m_ei;
                      pcVar18 = "edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n";
                      goto LAB_0040cc55;
                    }
                    local_78 = (double)((long)local_78 + 1);
                    if (local_78 == (double)uVar14) {
                      return uVar14 <= (ulong)local_78;
                    }
                  }
                  if (text_log == (ON_TextLog *)0x0) {
                    return false;
                  }
                  ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                  ON_TextLog::PushIndent(text_log);
                  pcVar18 = "edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n";
LAB_0040d227:
                  uVar16 = (ulong)uVar19;
                  goto LAB_0040cba7;
                }
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
                ON_TextLog::PushIndent(text_log);
                uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                        super_ON_ClassArray<ON_BrepVertex>.m_count;
                pcVar18 = "edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n";
              }
              uVar16 = (ulong)uVar4;
              local_78 = (double)(ulong)uVar19;
              goto LAB_0040cba7;
            }
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",uVar16);
            ON_TextLog::PushIndent(text_log);
            pdVar15 = ON_Interval::operator[](&local_50,0);
            local_78 = *pdVar15;
            pdVar15 = ON_Interval::operator[](&local_50,1);
            dVar21 = *pdVar15;
            pcVar18 = "m_E[%d].Domain() = (%g,%g) is not increasing\n";
          }
          else {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
            ON_TextLog::PushIndent(text_log);
            pdVar15 = ON_Interval::operator[](&local_60,0);
            local_78 = *pdVar15;
            pdVar15 = ON_Interval::operator[](&local_60,1);
            dVar21 = *pdVar15;
            pcVar18 = "m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n";
          }
          ON_TextLog::Print(text_log,pcVar18,local_78,dVar21,uVar16);
          goto LAB_0040cc96;
        }
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
        ON_TextLog::PushIndent(text_log);
        local_78 = (double)(ulong)(uint)this_00->m_c3i;
        uVar16 = (ulong)(uint)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
        pcVar18 = "edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n";
        goto LAB_0040cba7;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
      ON_TextLog::PushIndent(text_log);
      pcVar18 = "edge is not a valid.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
      ON_TextLog::PushIndent(text_log);
      pcVar18 = "edge.m_brep does not point to parent brep\n";
    }
LAB_0040cc8c:
    ON_TextLog::Print(text_log,pcVar18);
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar16);
    ON_TextLog::PushIndent(text_log);
    local_78 = (double)(ulong)(uint)this_00->m_edge_index;
    pcVar18 = "edge.m_edge_index = %d (should be %d).\n";
LAB_0040cba7:
    ON_TextLog::Print(text_log,pcVar18,local_78,uVar16);
  }
LAB_0040cc96:
  ON_TextLog::PopIndent(text_log);
  return false;
}

Assistant:

bool
ON_Brep::IsValidEdgeTopology( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }
  if ( edge.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_brep does not point to parent brep\n");
      text_log->PopIndent();
    }
    return false;
  }

  if ( !edge.IsValid(text_log) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge is not a valid.\n");
      text_log->PopIndent();
    }
    return false;
  }

  // This checks to make sure that m_C3[] and the edge's proxy information is valid.
  // This isn't exactly "topology", but if this stuff isn't set right, then the
  // "geometry" checks might crash.

  const int c3i = edge.m_c3i;
  if ( c3i < 0 || c3i >= m_C3.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n",
                      edge.m_c3i,m_C3.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  
  if ( 0 == m_C3[c3i] )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",edge_index,c3i,c3i);
    return false;
  }

  if ( 0 == edge.ProxyCurve() )
  {
    if ( text_log )
      text_log->Print("brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n",edge_index,c3i);
    return false;
  }

  if ( m_C3[c3i] != edge.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n",edge_index,c3i,c3i,edge_index);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval proxy_sub_dom = edge.ProxyCurveDomain();
  if ( !proxy_sub_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval c3_dom = m_C3[c3i]->Domain();
  if ( !c3_dom.Includes(proxy_sub_dom) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",
                      c3i,c3_dom[0],c3_dom[1],edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval edge_dom = edge.Domain();
  if ( !edge_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] trim is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].Domain() = (%g,%g) is not increasing\n",edge_index,edge_dom[0],edge_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }



  const int vi0 = edge.m_vi[0];
  const int vi1 = edge.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  int evi;
  for ( evi = 0; evi < 2; evi++ ) 
  {
    const ON_BrepVertex& vertex = m_V[edge.m_vi[evi]];

    if ( edge.m_vi[evi] != vertex.m_vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d is a deleted vertex\n",
                         evi,edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }


    const int vertex_edge_count = vertex.m_ei.Count();
    bool bFoundIt = false;
    int vei;
    for ( vei = 0; vei < vertex_edge_count && !bFoundIt; vei++ ) 
    {
      bFoundIt = (vertex.m_ei[vei] == edge_index);
    }
    if ( !bFoundIt )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n",
                         evi,edge.m_vi[evi],edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }
  }

  const int edge_trim_count = edge.m_ti.Count();
  if ( edge_trim_count < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_ti.Count() < 0\n");
      text_log->PopIndent();
    }
    return false;
  }
  int i, eti, ti;
  for (eti = 0; eti < edge_trim_count; eti++ )
  {
    ti = edge.m_ti[eti];
    if ( ti < 0 || ti >= m_T.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    if ( m_T[ti].m_trim_index != ti )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d is a deleted trim\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    for ( i = 0; i < eti; i++ ) 
    {
      if ( edge.m_ti[i] == ti )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
          text_log->PushIndent();
          text_log->Print("edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n",i,eti,ti);
          text_log->PopIndent();
        }
        return false;
      }
    }
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_ei != edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n",eti,ti,ti,trim.m_ei);
        text_log->PopIndent();
      }
      return false;
    }
  }

  return true;
}